

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

void TTD::NSSnapValues::ParsePromiseCapabilityInfo
               (SnapPromiseCapabilityInfo *capabilityInfo,bool readSeparator,FileReader *reader,
               SlabAllocator *alloc)

{
  TTD_PTR_ID TVar1;
  TTDVar pvVar2;
  undefined7 in_register_00000031;
  
  (*reader->_vptr_FileReader[6])(reader,CONCAT71(in_register_00000031,readSeparator));
  TVar1 = FileReader::ReadAddr(reader,ptrIdVal,false);
  capabilityInfo->CapabilityId = TVar1;
  (*reader->_vptr_FileReader[3])(reader,3,1);
  pvVar2 = ParseTTDVar(false,reader);
  capabilityInfo->PromiseVar = pvVar2;
  (*reader->_vptr_FileReader[3])(reader,3,1);
  pvVar2 = ParseTTDVar(false,reader);
  capabilityInfo->ResolveVar = pvVar2;
  (*reader->_vptr_FileReader[3])(reader,3,1);
  pvVar2 = ParseTTDVar(false,reader);
  capabilityInfo->RejectVar = pvVar2;
  (*reader->_vptr_FileReader[7])(reader);
  return;
}

Assistant:

void ParsePromiseCapabilityInfo(SnapPromiseCapabilityInfo* capabilityInfo, bool readSeparator, FileReader* reader, SlabAllocator& alloc)
        {
            reader->ReadRecordStart(readSeparator);

            capabilityInfo->CapabilityId = reader->ReadAddr(NSTokens::Key::ptrIdVal);

            reader->ReadKey(NSTokens::Key::entry, true);
            capabilityInfo->PromiseVar = ParseTTDVar(false, reader);

            reader->ReadKey(NSTokens::Key::entry, true);
            capabilityInfo->ResolveVar = ParseTTDVar(false, reader);

            reader->ReadKey(NSTokens::Key::entry, true);
            capabilityInfo->RejectVar = ParseTTDVar(false, reader);

            reader->ReadRecordEnd();
        }